

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ColorMaskCase::iterate(ColorMaskCase *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  GLenum err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  Vector<bool,_4> local_230;
  int local_22c;
  GLuint local_228;
  int ndx_5;
  int ndx_4;
  allocator<char> local_1f9;
  string local_1f8;
  ScopedLogSection local_1d8;
  ScopedLogSection section_3;
  GLuint local_1c8;
  int ndx_3;
  int ndx_2;
  allocator<char> local_199;
  string local_198;
  ScopedLogSection local_178;
  ScopedLogSection section_2;
  int local_168;
  allocator<char> local_161;
  int ndx_1;
  allocator<char> local_139;
  string local_138;
  ScopedLogSection local_118;
  ScopedLogSection section_1;
  int local_108;
  allocator<char> local_101;
  int ndx;
  allocator<char> local_d9;
  string local_d8;
  ScopedLogSection local_b8;
  ScopedLogSection section;
  deInt32 maxDrawBuffers;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  ColorMaskCase *this_local;
  
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar3,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  section.m_log._0_4_ = 0;
  this_00 = (CallLogWrapper *)((long)&result.m_message.field_2 + 8);
  glu::CallLogWrapper::enableLogging(this_00,true);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8824,(GLint *)&section);
  err = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x3cc);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Initial",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ndx,"Initial value",&local_101);
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar3,&local_d8,(string *)&ndx);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  for (local_108 = 0; local_108 < (int)section.m_log; local_108 = local_108 + 1) {
    tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)((long)&section_1.m_log + 4),true);
    deqp::gls::StateQueryUtil::verifyStateIndexedBooleanVec4
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0xc23,local_108,(BVec4 *)((long)&section_1.m_log + 4),this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_b8);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"AfterSettingCommon",&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_1,"After setting common",&local_161);
  tcu::ScopedLogSection::ScopedLogSection(&local_118,pTVar3,&local_138,(string *)&ndx_1);
  std::__cxx11::string::~string((string *)&ndx_1);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  glu::CallLogWrapper::glColorMask
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),'\0','\x01','\x01','\0');
  for (local_168 = 0; local_168 < (int)section.m_log; local_168 = local_168 + 1) {
    tcu::Vector<bool,_4>::Vector
              ((Vector<bool,_4> *)((long)&section_2.m_log + 4),false,true,true,false);
    deqp::gls::StateQueryUtil::verifyStateIndexedBooleanVec4
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0xc23,local_168,(BVec4 *)((long)&section_2.m_log + 4),this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_118);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"AfterSettingIndexed",&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_2,"After setting indexed",(allocator<char> *)((long)&ndx_3 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_178,pTVar3,&local_198,(string *)&ndx_2);
  std::__cxx11::string::~string((string *)&ndx_2);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_3 + 3));
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  for (local_1c8 = 0; (int)local_1c8 < (int)section.m_log; local_1c8 = local_1c8 + 1) {
    iVar1 = (int)local_1c8 % 2;
    glu::CallLogWrapper::glColorMaski
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),local_1c8,iVar1 == 0,
               iVar1 == 1,iVar1 == 0,iVar1 == 1);
  }
  for (section_3.m_log._4_4_ = 0; iVar1 = section_3.m_log._4_4_,
      section_3.m_log._4_4_ < (int)section.m_log; section_3.m_log._4_4_ = section_3.m_log._4_4_ + 1)
  {
    if (section_3.m_log._4_4_ % 2 == 0) {
      tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&section_3,true,false,true,false);
    }
    else {
      tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&section_3,false,true,false,true);
    }
    deqp::gls::StateQueryUtil::verifyStateIndexedBooleanVec4
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0xc23,iVar1,(BVec4 *)&section_3,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_178);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"AfterResettingIndexedWithCommon",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_4,"After resetting indexed with common",
             (allocator<char> *)((long)&ndx_5 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_1d8,pTVar3,&local_1f8,(string *)&ndx_4);
  std::__cxx11::string::~string((string *)&ndx_4);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_5 + 3));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  for (local_228 = 0; (int)local_228 < (int)section.m_log; local_228 = local_228 + 1) {
    iVar1 = (int)local_228 % 2;
    glu::CallLogWrapper::glColorMaski
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),local_228,iVar1 == 0,
               iVar1 == 1,iVar1 == 0,iVar1 == 1);
  }
  glu::CallLogWrapper::glColorMask
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),'\0','\x01','\x01','\0');
  for (local_22c = 0; iVar1 = local_22c, local_22c < (int)section.m_log; local_22c = local_22c + 1)
  {
    tcu::Vector<bool,_4>::Vector(&local_230,false,true,true,false);
    deqp::gls::StateQueryUtil::verifyStateIndexedBooleanVec4
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0xc23,iVar1,&local_230,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_1d8);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

ColorMaskCase::IterateResult ColorMaskCase::iterate (void)
{
	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBooleanVec4(result, gl, GL_COLOR_WRITEMASK, ndx, tcu::BVec4(true), m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glColorMask(GL_FALSE, GL_TRUE, GL_TRUE, GL_FALSE);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBooleanVec4(result, gl, GL_COLOR_WRITEMASK, ndx, tcu::BVec4(false, true, true, false), m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glColorMaski(ndx, (ndx % 2 == 0 ? GL_TRUE : GL_FALSE), (ndx % 2 == 1 ? GL_TRUE : GL_FALSE), (ndx % 2 == 0 ? GL_TRUE : GL_FALSE), (ndx % 2 == 1 ? GL_TRUE : GL_FALSE));

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBooleanVec4(result, gl, GL_COLOR_WRITEMASK, ndx, (ndx % 2 == 0 ? tcu::BVec4(true, false, true, false) : tcu::BVec4(false, true, false, true)), m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glColorMaski(ndx, (ndx % 2 == 0 ? GL_TRUE : GL_FALSE), (ndx % 2 == 1 ? GL_TRUE : GL_FALSE), (ndx % 2 == 0 ? GL_TRUE : GL_FALSE), (ndx % 2 == 1 ? GL_TRUE : GL_FALSE));

		gl.glColorMask(GL_FALSE, GL_TRUE, GL_TRUE, GL_FALSE);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBooleanVec4(result, gl, GL_COLOR_WRITEMASK, ndx, tcu::BVec4(false, true, true, false), m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}